

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

bool rr::LineRasterUtil::vertexOnLeftSideOfLine(Vector<long,_2> *p,SubpixelLineSegment *l)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  deInt64 crossProduct;
  Vector<long,_2> v;
  Vector<long,_2> u;
  SubpixelLineSegment *l_local;
  Vector<long,_2> *p_local;
  
  SubpixelLineSegment::direction((SubpixelLineSegment *)(v.m_data + 1));
  tcu::operator-((tcu *)&crossProduct,p,&l->m_v0);
  lVar1 = tcu::Vector<long,_2>::x((Vector<long,_2> *)(v.m_data + 1));
  lVar2 = tcu::Vector<long,_2>::y((Vector<long,_2> *)&crossProduct);
  lVar3 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(v.m_data + 1));
  lVar4 = tcu::Vector<long,_2>::x((Vector<long,_2> *)&crossProduct);
  return lVar1 * lVar2 - lVar3 * lVar4 < 0;
}

Assistant:

static bool vertexOnLeftSideOfLine (const tcu::Vector<deInt64,2>& p, const SubpixelLineSegment& l)
{
	const tcu::Vector<deInt64,2> u = l.direction();
	const tcu::Vector<deInt64,2> v = ( p - l.m_v0);
	const deInt64 crossProduct = (u.x() * v.y() - u.y() * v.x());
	return crossProduct < 0;
}